

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall
google::protobuf::UnknownFieldSet::MergeFrom(UnknownFieldSet *this,UnknownFieldSet *other)

{
  int iVar1;
  int iVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  Arena *arena;
  UnknownField value;
  UnknownField elem;
  UnknownField local_38;
  
  iVar1 = RepeatedField<google::protobuf::UnknownField>::size(&other->fields_);
  if (0 < iVar1) {
    iVar2 = RepeatedField<google::protobuf::UnknownField>::size(&this->fields_);
    RepeatedField<google::protobuf::UnknownField>::Reserve(&this->fields_,iVar1 + iVar2);
    cVar3 = RepeatedField<google::protobuf::UnknownField>::begin(&other->fields_);
    cVar4 = RepeatedField<google::protobuf::UnknownField>::end(&other->fields_);
    for (; cVar3.it_ != cVar4.it_; cVar3.it_ = cVar3.it_ + 1) {
      local_38.number_ = (cVar3.it_)->number_;
      local_38.type_ = (cVar3.it_)->type_;
      local_38.data_ = (cVar3.it_)->data_;
      arena = RepeatedField<google::protobuf::UnknownField>::GetArena(&this->fields_);
      value = UnknownField::DeepCopy(&local_38,arena);
      RepeatedField<google::protobuf::UnknownField>::Add(&this->fields_,value);
    }
  }
  return;
}

Assistant:

void UnknownFieldSet::MergeFrom(const UnknownFieldSet& other) {
  int other_field_count = other.field_count();
  if (other_field_count > 0) {
    fields_.Reserve(fields_.size() + other_field_count);
    for (auto elem : other.fields_) {
      fields_.Add(elem.DeepCopy(arena()));
    }
  }
}